

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  TPZStructMatrix *pTVar1;
  TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *in_RDI;
  TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *unaff_retaddr;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0x130);
  TPZSBandStructMatrix(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}